

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O1

int __thiscall
zmq::detail::socket_base::bind(socket_base *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  error_t *this_00;
  undefined4 in_register_00000034;
  
  iVar1 = zmq_bind(this->_handle,CONCAT44(in_register_00000034,__fd));
  if (iVar1 == 0) {
    return 0;
  }
  this_00 = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this_00);
  __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

void bind(const char *addr_)
    {
        int rc = zmq_bind(_handle, addr_);
        if (rc != 0)
            throw error_t();
    }